

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void pbrt::Log(LogLevel level,char *file,int line,char *s)

{
  uint uVar1;
  FILE *__stream;
  uint uVar2;
  size_t sVar3;
  LogLevel level_00;
  uint *in_FS_OFFSET;
  long *local_70;
  long local_60 [2];
  string local_50;
  
  sVar3 = strlen(s);
  __stream = _stderr;
  if ((int)sVar3 != 0) {
    uVar2 = getpid();
    pbrt::ThreadIndex::__tls_init();
    uVar1 = *in_FS_OFFSET;
    (anonymous_namespace)::TimeNow_abi_cxx11_();
    ToString_abi_cxx11_(&local_50,(pbrt *)(ulong)level,level_00);
    fprintf(__stream,"[ %d.%03d %s %s:%d ] %s %s\n",(ulong)uVar2,(ulong)uVar1,local_70,file,
            (ulong)(uint)line,local_50._M_dataplus._M_p,s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  return;
}

Assistant:

void Log(LogLevel level, const char *file, int line, const char *s) {
#ifdef PBRT_IS_GPU_CODE
    auto strlen = [](const char *ptr) {
        int len = 0;
        while (*ptr) {
            ++len;
            ++ptr;
        }
        return len;
    };

    // Grab a slot
    int offset = atomicAdd(&nRawLogItems, 1);
    GPULogItem &item = rawLogItems[offset % MAX_LOG_ITEMS];
    item.level = level;

    // If the file name is too long to fit in GPULogItem.file, then copy
    // the trailing bits.
    int len = strlen(file);
    if (len + 1 > sizeof(item.file)) {
        int start = len - sizeof(item.file) + 1;
        if (start < 0)
            start = 0;
        for (int i = start; i < len; ++i)
            item.file[i - start] = file[i];
        item.file[len - start] = '\0';

        // Now clobber the start with "..." to show it was truncated
        item.file[0] = item.file[1] = item.file[2] = '.';
    } else {
        for (int i = 0; i < len; ++i)
            item.file[i] = file[i];
        item.file[len] = '\0';
    }

    item.line = line;

    // Copy as much of the message as we can...
    int i;
    for (i = 0; i < sizeof(item.message) - 1 && *s; ++i, ++s)
        item.message[i] = *s;
    item.message[i] = '\0';
#else
    int len = strlen(s);
    if (len == 0)
        return;
    fprintf(stderr, "[ " LOG_BASE_FMT " %s:%d ] %s %s\n", LOG_BASE_ARGS, file, line,
            ToString(level).c_str(), s);
#endif
}